

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O3

bool __thiscall polyscope::TransformationGizmo::interact(TransformationGizmo *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ulong uVar13;
  undefined4 uVar18;
  ulong uVar14;
  ulong uVar15;
  undefined4 uVar19;
  ulong uVar16;
  ulong uVar17;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  TransformHandle TVar30;
  mat4 *pmVar31;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *pPVar32;
  float fVar33;
  undefined1 auVar34 [16];
  vec2 screenCoords;
  undefined1 auVar35 [16];
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar36;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar37;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar38;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar39;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar40;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar41;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar42;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar43;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar44;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar45;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar46;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar47;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar48;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar49;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar50;
  bool bVar51;
  ImGuiIO *pIVar52;
  mapped_type *pmVar53;
  undefined8 unaff_RBP;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar54;
  TransformationGizmo *in_RSI;
  ulong uVar55;
  int iVar56;
  ulong uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar72;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar73;
  float fVar81;
  float fVar82;
  undefined8 in_XMM0_Qb;
  undefined8 uVar83;
  float fVar84;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar80 [64];
  float fVar96;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  vec3 vVar133;
  vec3 raySource;
  vec3 raySource_00;
  vec3 raySource_01;
  vec3 raySource_02;
  vec3 raySource_03;
  vec3 rayDir;
  vec3 rayDir_00;
  vec3 rayDir_01;
  vec3 center;
  vec3 center_00;
  vec3 center_01;
  vec3 center_02;
  vec3 center_03;
  vec3 center_04;
  vec3 normal;
  vec3 normal_00;
  vec3 tangent;
  vec3 tangent_00;
  vec4 trans;
  tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> local_118;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_fc;
  undefined1 local_f8 [16];
  float local_e4;
  float local_e0;
  float local_dc;
  undefined1 local_d8 [4];
  undefined1 auStack_d4 [4];
  undefined1 auStack_d0 [8];
  undefined1 local_c8 [24];
  uint local_b0;
  float local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_98;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  ImGuiIO *local_78;
  ulong local_70;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_68;
  undefined8 local_64;
  float local_5c;
  undefined8 local_58;
  float local_50;
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  
  auVar59 = in_ZMM19._0_16_;
  auVar58 = in_ZMM18._0_16_;
  if ((this->enabled).value != true) {
    return false;
  }
  _auStack_d0 = local_d8._8_12_;
  pIVar52 = ImGui::GetIO();
  uVar57 = CONCAT71((int7)((ulong)unaff_RBP >> 8),this->currentlyDragging);
  if ((this->currentlyDragging == true) &&
     ((bVar51 = ImGui::IsMouseDown(0), !bVar51 ||
      (bVar51 = ImGui::IsMousePosValid((ImVec2 *)0x0), !bVar51)))) {
    this->currentlyDragging = false;
  }
  vVar133 = view::getCameraWorldPosition();
  _auStack_d4 = _auStack_d0;
  raySource.field_2 = vVar133.field_2;
  local_98 = vVar133.field_0;
  aStack_94 = vVar133.field_1;
  uStack_90 = (undefined4)in_XMM0_Qb;
  uStack_8c = (undefined4)((ulong)in_XMM0_Qb >> 0x20);
  screenCoords.field_0 =
       (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)(pIVar52->MousePos).x;
  screenCoords.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)(pIVar52->MousePos).y;
  uVar83._0_1_ = pIVar52->MouseDown[0];
  uVar83._1_1_ = pIVar52->MouseDown[1];
  uVar83._2_1_ = pIVar52->MouseDown[2];
  uVar83._3_1_ = pIVar52->MouseDown[3];
  uVar83._4_1_ = pIVar52->MouseDown[4];
  uVar83._5_3_ = *(undefined3 *)&pIVar52->field_0x12d;
  vVar133 = view::screenCoordsToWorldRay(screenCoords);
  local_a8 = vVar133._0_8_;
  pmVar31 = this->T;
  local_88._0_4_ = vVar133.field_2;
  auVar58 = vxorps_avx512vl(auVar58,auVar58);
  auVar59 = vxorps_avx512vl(auVar59,auVar59);
  fVar72 = pmVar31->value[0].field_2.z;
  fVar71 = pmVar31->value[1].field_2.z;
  fVar81 = pmVar31->value[2].field_2.z;
  fVar96 = pmVar31->value[3].field_2.z;
  uVar55._0_4_ = pmVar31->value[1].field_0;
  uVar55._4_4_ = pmVar31->value[1].field_1;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar55;
  uVar13._0_4_ = pmVar31->value[2].field_0;
  uVar13._4_4_ = pmVar31->value[2].field_1;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar13;
  uVar1 = pmVar31->value[3].field_0;
  uVar18 = pmVar31->value[3].field_1;
  auVar67._4_4_ = uVar18;
  auVar67._0_4_ = uVar1;
  auVar67._8_8_ = 0;
  uVar14._0_4_ = pmVar31->value[0].field_0;
  uVar14._4_4_ = pmVar31->value[0].field_1;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar14;
  auVar60 = vmulss_avx512f(ZEXT416((uint)fVar72),auVar58);
  auVar61 = vmulss_avx512f(ZEXT416((uint)fVar71),auVar58);
  auVar62 = vmulss_avx512f(ZEXT416((uint)fVar81),auVar58);
  auVar63 = vmulps_avx512vl(auVar63,auVar59);
  auVar64 = vmulps_avx512vl(auVar64,auVar59);
  auVar65 = vmulps_avx512vl(auVar65,auVar59);
  fVar33 = auVar60._0_4_ + auVar61._0_4_;
  auVar66 = vaddps_avx512vl(auVar63,auVar67);
  auVar68._0_4_ = auVar65._0_4_ + auVar64._0_4_;
  auVar68._4_4_ = auVar65._4_4_ + auVar64._4_4_;
  auVar68._8_4_ = auVar65._8_4_ + auVar64._8_4_;
  auVar68._12_4_ = auVar65._12_4_ + auVar64._12_4_;
  local_fc.z = 0.0;
  auVar58 = vmulss_avx512f(ZEXT416((uint)fVar96),auVar58);
  auVar59 = vmulps_avx512vl(auVar67,auVar59);
  local_c8._0_4_ = auVar62._0_4_ + fVar96 + fVar33;
  local_f8 = vaddps_avx512vl(auVar68,auVar66);
  fVar96 = auVar62._0_4_ + auVar58._0_4_;
  local_48 = ZEXT816(0) << 0x20;
  fVar33 = fVar33 + fVar81 + auVar58._0_4_;
  auVar62 = vaddps_avx512vl(auVar63,auVar59);
  fVar72 = fVar96 + fVar72 + auVar61._0_4_;
  fVar96 = fVar96 + auVar60._0_4_ + fVar71;
  fVar71 = auVar64._0_4_ + (float)(undefined4)uVar14 + auVar62._0_4_;
  fVar81 = auVar64._4_4_ + (float)uVar14._4_4_ + auVar62._4_4_;
  fVar82 = auVar64._8_4_ + 0.0 + auVar62._8_4_;
  fVar84 = auVar64._12_4_ + 0.0 + auVar62._12_4_;
  auVar66._0_4_ = fVar71 * fVar71;
  auVar66._4_4_ = fVar81 * fVar81;
  auVar66._8_4_ = fVar82 * fVar82;
  auVar66._12_4_ = fVar84 * fVar84;
  auVar58 = vhaddps_avx(auVar66,auVar66);
  auVar58 = ZEXT416((uint)(auVar58._0_4_ + fVar72 * fVar72));
  auVar58 = vsqrtss_avx(auVar58,auVar58);
  fVar111 = 1.0 / auVar58._0_4_;
  auVar58._0_4_ = fVar111 * fVar71;
  auVar58._4_4_ = fVar111 * fVar81;
  auVar58._8_4_ = fVar111 * fVar82;
  auVar58._12_4_ = fVar111 * fVar84;
  local_70 = vmovlps_avx(auVar58);
  local_68.z = fVar111 * fVar72;
  fVar71 = auVar65._0_4_ + (float)(undefined4)uVar55 + auVar62._0_4_;
  fVar81 = auVar65._4_4_ + (float)uVar55._4_4_ + auVar62._4_4_;
  fVar82 = auVar65._8_4_ + 0.0 + auVar62._8_4_;
  fVar84 = auVar65._12_4_ + 0.0 + auVar62._12_4_;
  auVar62._0_4_ = fVar71 * fVar71;
  auVar62._4_4_ = fVar81 * fVar81;
  auVar62._8_4_ = fVar82 * fVar82;
  auVar62._12_4_ = fVar84 * fVar84;
  auVar58 = vhaddps_avx(auVar62,auVar62);
  auVar58 = ZEXT416((uint)(auVar58._0_4_ + fVar96 * fVar96));
  auVar58 = vsqrtss_avx(auVar58,auVar58);
  fVar72 = 1.0 / auVar58._0_4_;
  auVar60._0_4_ = fVar71 * fVar72;
  auVar60._4_4_ = fVar81 * fVar72;
  auVar60._8_4_ = fVar82 * fVar72;
  auVar60._12_4_ = fVar84 * fVar72;
  local_64 = vmovlps_avx(auVar60);
  local_5c = fVar96 * fVar72;
  fVar71 = auVar68._0_4_ + auVar59._0_4_ + (float)(undefined4)uVar13;
  fVar81 = auVar68._4_4_ + auVar59._4_4_ + (float)uVar13._4_4_;
  fVar96 = auVar68._8_4_ + auVar59._8_4_ + 0.0;
  fVar82 = auVar68._12_4_ + auVar59._12_4_ + 0.0;
  auVar61._0_4_ = fVar71 * fVar71;
  auVar61._4_4_ = fVar81 * fVar81;
  auVar61._8_4_ = fVar96 * fVar96;
  auVar61._12_4_ = fVar82 * fVar82;
  auVar58 = vhaddps_avx(auVar61,auVar61);
  auVar58 = ZEXT416((uint)(auVar58._0_4_ + fVar33 * fVar33));
  auVar58 = vsqrtss_avx(auVar58,auVar58);
  fVar72 = 1.0 / auVar58._0_4_;
  auVar59._0_4_ = fVar71 * fVar72;
  auVar59._4_4_ = fVar81 * fVar72;
  auVar59._8_4_ = fVar96 * fVar72;
  auVar59._12_4_ = fVar82 * fVar72;
  local_58 = vmovlps_avx(auVar59);
  local_50 = fVar33 * fVar72;
  fVar72 = pmVar31->value[0].field_0.x;
  fVar71 = pmVar31->value[0].field_1.y;
  fVar81 = pmVar31->value[0].field_2.z;
  auVar58 = ZEXT416((uint)(fVar72 * fVar72 + fVar71 * fVar71 + fVar81 * fVar81));
  auVar58 = vsqrtss_avx(auVar58,auVar58);
  local_ac = auVar58._0_4_ * this->gizmoSizeRel * state::lengthScale;
  local_dc = local_ac * this->diskWidthObj;
  uStack_a0 = uVar83;
  if (this->currentlyDragging == false) {
    local_e4 = local_ac - local_dc;
    local_b0 = (uint)uVar57;
    uVar55 = 0xffffffff;
    paVar54 = &local_68;
    uVar57 = 0;
    iVar56 = 0;
    local_d8 = (undefined1  [4])0x7f800000;
    local_e0 = INFINITY;
    local_78 = pIVar52;
    do {
      auVar58 = local_f8;
      vVar133.field_1 = aStack_94;
      vVar133.field_0 = local_98;
      vVar133.field_2 = raySource.field_2;
      rayDir.field_2 =
           (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_88._0_4_;
      rayDir.field_0.x = (float)local_a8;
      rayDir.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_a8._4_4_;
      center_00.field_2.z = (float)local_c8._0_4_;
      center_00.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_f8._0_4_;
      center_00.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_f8._4_4_;
      normal_00.field_2 = *paVar54;
      normal_00._0_8_ = *(undefined8 *)(paVar54 + -2);
      local_f8 = auVar58;
      circleTest(&local_118,in_RSI,vVar133,rayDir,center_00,normal_00,local_e4);
      if ((local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<1UL,_float,_false>._M_head_impl < local_dc) &&
         (local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Head_base<0UL,_float,_false>._M_head_impl < (float)local_d8)) {
        iVar56 = 1;
        uVar55 = uVar57 & 0xffffffff;
        local_e0 = local_118.
                   super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Head_base<1UL,_float,_false>._M_head_impl;
        local_d8 = (undefined1  [4])
                   local_118.
                   super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Head_base<0UL,_float,_false>._M_head_impl;
        local_48._8_8_ = 0;
        local_48._0_4_ =
             local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
             field_0;
        local_48._4_4_ =
             local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
             field_1;
        local_fc = local_118.
                   super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
                   field_2;
      }
      uVar57 = uVar57 + 1;
      paVar54 = paVar54 + 3;
    } while (uVar57 != 3);
    paVar54 = &local_68;
    uVar57 = 0;
    local_e4 = local_ac * this->vecLength;
    do {
      auVar58 = local_f8;
      raySource_00.field_1 = aStack_94;
      raySource_00.field_0 = local_98;
      raySource_00.field_2 = raySource.field_2;
      rayDir_00.field_2 =
           (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_88._0_4_;
      rayDir_00.field_0.x = (float)local_a8;
      rayDir_00.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_a8._4_4_;
      center_01.field_2.z = (float)local_c8._0_4_;
      center_01.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_f8._0_4_;
      center_01.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_f8._4_4_;
      tangent.field_2 = *paVar54;
      tangent._0_8_ = *(undefined8 *)(paVar54 + -2);
      local_f8 = auVar58;
      lineTest(&local_118,in_RSI,raySource_00,rayDir_00,center_01,tangent,local_e4);
      auVar58 = local_f8;
      if ((local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<1UL,_float,_false>._M_head_impl < local_dc) &&
         (local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Head_base<0UL,_float,_false>._M_head_impl - local_dc < (float)local_d8)) {
        iVar56 = 2;
        uVar55 = uVar57 & 0xffffffff;
        local_e0 = local_118.
                   super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Head_base<1UL,_float,_false>._M_head_impl;
        local_48._8_8_ = 0;
        local_48._0_4_ =
             local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
             field_0;
        local_48._4_4_ =
             local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
             field_1;
        local_fc = local_118.
                   super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
                   field_2;
        local_d8 = (undefined1  [4])
                   (local_118.
                    super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Head_base<0UL,_float,_false>._M_head_impl - local_dc);
      }
      uVar57 = uVar57 + 1;
      paVar54 = paVar54 + 3;
    } while (uVar57 != 3);
    raySource_01.field_1 = aStack_94;
    raySource_01.field_0 = local_98;
    raySource_01.field_2 = raySource.field_2;
    rayDir_01.field_2 =
         (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_88._0_4_;
    rayDir_01.field_0.x = (float)local_a8;
    rayDir_01.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_a8._4_4_;
    center_02.field_2.z = (float)local_c8._0_4_;
    center_02.field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_f8._0_4_;
    center_02.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_f8._4_4_;
    local_f8 = auVar58;
    sphereTest(&local_118,in_RSI,raySource_01,rayDir_01,center_02,local_ac * this->sphereRad,true);
    if (((local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Head_base<1UL,_float,_false>._M_head_impl != 0.0) ||
        (NAN(local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<1UL,_float,_false>._M_head_impl))) ||
       ((float)local_d8 <=
        local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
        super__Head_base<0UL,_float,_false>._M_head_impl)) {
      uVar57 = (ulong)local_b0;
      this->selectedDim = -1;
      this->selectedType = None;
      if ((iVar56 != 1) || (local_dc <= local_e0)) {
        if ((iVar56 != 2) || (local_dc <= local_e0)) goto LAB_00235fa2;
        this->selectedType = Translation;
        this->selectedDim = (int)uVar55;
        bVar51 = ImGui::IsMouseClicked(0,false);
        if ((!bVar51) || (local_78->WantCaptureMouse != false)) goto LAB_00235fa2;
        this->currentlyDragging = true;
        uVar83 = vmovlps_avx(local_48);
        (this->dragPrevVec).field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar83;
        (this->dragPrevVec).field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
             (int)((ulong)uVar83 >> 0x20);
        aVar73 = local_fc;
      }
      else {
        this->selectedType = Rotation;
        this->selectedDim = (int)uVar55;
        bVar51 = ImGui::IsMouseClicked(0,false);
        if ((!bVar51) || (local_78->WantCaptureMouse != false)) goto LAB_00235fa2;
        this->currentlyDragging = true;
        auVar58 = vsubps_avx(local_48,local_f8);
        fVar33 = local_fc.z - (float)local_c8._0_4_;
        fVar72 = auVar58._0_4_;
        auVar70._0_4_ = fVar72 * fVar72;
        fVar71 = auVar58._4_4_;
        auVar70._4_4_ = fVar71 * fVar71;
        fVar81 = auVar58._8_4_;
        auVar70._8_4_ = fVar81 * fVar81;
        fVar96 = auVar58._12_4_;
        auVar70._12_4_ = fVar96 * fVar96;
        auVar58 = vhaddps_avx(auVar70,auVar70);
        auVar58 = ZEXT416((uint)(auVar58._0_4_ + fVar33 * fVar33));
        auVar58 = vsqrtss_avx(auVar58,auVar58);
        fVar82 = 1.0 / auVar58._0_4_;
        aVar73.z = fVar33 * fVar82;
        auVar69._0_4_ = fVar72 * fVar82;
        auVar69._4_4_ = fVar71 * fVar82;
        auVar69._8_4_ = fVar81 * fVar82;
        auVar69._12_4_ = fVar96 * fVar82;
        uVar83 = vmovlps_avx(auVar69);
        (this->dragPrevVec).field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar83;
        (this->dragPrevVec).field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
             (int)((ulong)uVar83 >> 0x20);
      }
    }
    else {
      this->selectedDim = -1;
      this->selectedType = Scale;
      unique0x10002075 = 0;
      local_d8 = (undefined1  [4])
                 local_118.
                 super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                 super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                 super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                 super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
                 field_0;
      auStack_d4 = (undefined1  [4])
                   local_118.
                   super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
                   field_1;
      local_f8._0_4_ =
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2;
      bVar51 = ImGui::IsMouseClicked(0,false);
      uVar57 = (ulong)local_b0;
      if ((!bVar51) || (local_78->WantCaptureMouse != false)) goto LAB_00235fa2;
      this->currentlyDragging = true;
LAB_00235d8f:
      uVar83 = vmovlps_avx(_local_d8);
      (this->dragPrevVec).field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar83;
      (this->dragPrevVec).field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar83 >> 0x20);
      aVar73 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_f8._0_4_;
    }
  }
  else {
    TVar30 = this->selectedType;
    if (TVar30 == Scale) {
      local_ac = local_ac * this->sphereRad;
      raySource_03.field_1 = aStack_94;
      raySource_03.field_0 = local_98;
      local_d8 = (undefined1  [4])local_ac;
      raySource_03.field_2 = raySource.field_2;
      center_04.field_2.z = (float)local_c8._0_4_;
      center_04.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_f8._0_4_;
      center_04.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_f8._4_4_;
      sphereTest(&local_118,in_RSI,raySource_03,vVar133,center_04,local_ac,false);
      if (INFINITY <=
          local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Head_base<1UL,_float,_false>._M_head_impl) goto LAB_00235fa2;
      aVar73 = local_118.
               super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
               super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
               super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
               super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
               field_2;
      auVar90._8_8_ = 0;
      auVar90._0_4_ =
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0;
      auVar90._4_4_ =
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1;
      pmVar31 = this->T;
      fVar72 = local_118.
               super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
               super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
               super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
               super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
               field_2.z - (float)local_c8._0_4_;
      auVar58 = vsubps_avx(auVar90,local_f8);
      auVar91._0_4_ = auVar58._0_4_ * auVar58._0_4_;
      auVar91._4_4_ = auVar58._4_4_ * auVar58._4_4_;
      auVar91._8_4_ = auVar58._8_4_ * auVar58._8_4_;
      auVar91._12_4_ = auVar58._12_4_ * auVar58._12_4_;
      auVar58 = vhaddps_avx(auVar91,auVar91);
      local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
            &pmVar31->value[3].field_0;
      local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)
            &pmVar31->value[3].field_1;
      local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
           *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
            &pmVar31->value[3].field_2;
      local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<1UL,_float,_false>._M_head_impl = *(float *)&pmVar31->value[3].field_3;
      auVar58 = ZEXT416((uint)(auVar58._0_4_ + fVar72 * fVar72));
      auVar58 = vsqrtss_avx(auVar58,auVar58);
      fVar72 = auVar58._0_4_ / (float)local_d8;
      pmVar31->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
      pmVar31->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
      pmVar31->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
      pmVar31->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
      pmVar31 = this->T;
      uVar5 = pmVar31->value[0].field_0;
      uVar22 = pmVar31->value[0].field_1;
      uVar6 = pmVar31->value[0].field_2;
      uVar23 = pmVar31->value[0].field_3;
      uVar7 = pmVar31->value[1].field_0;
      uVar24 = pmVar31->value[1].field_1;
      uVar8 = pmVar31->value[1].field_2;
      uVar25 = pmVar31->value[1].field_3;
      auVar92._0_4_ = fVar72 * (float)uVar5;
      auVar92._4_4_ = fVar72 * (float)uVar22;
      auVar92._8_4_ = fVar72 * 0.0;
      auVar92._12_4_ = fVar72 * 0.0;
      auVar98._0_4_ = fVar72 * (float)uVar6;
      auVar98._4_4_ = fVar72 * (float)uVar23;
      auVar98._8_4_ = fVar72 * 0.0;
      auVar98._12_4_ = fVar72 * 0.0;
      uVar83 = vmovlps_avx(auVar92);
      pmVar31->value[0].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar83;
      pmVar31->value[0].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar83 >> 0x20);
      uVar83 = vmovlps_avx(auVar98);
      pmVar31->value[0].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar83;
      pmVar31->value[0].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar83 >> 0x20);
      auVar93._0_4_ = fVar72 * (float)uVar7;
      auVar93._4_4_ = fVar72 * (float)uVar24;
      auVar93._8_4_ = fVar72 * 0.0;
      auVar93._12_4_ = fVar72 * 0.0;
      auVar99._0_4_ = fVar72 * (float)uVar8;
      auVar99._4_4_ = fVar72 * (float)uVar25;
      auVar99._8_4_ = fVar72 * 0.0;
      auVar99._12_4_ = fVar72 * 0.0;
      uVar83 = vmovlps_avx(auVar93);
      pmVar31->value[1].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar83;
      pmVar31->value[1].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar83 >> 0x20);
      uVar83 = vmovlps_avx(auVar99);
      pmVar31->value[1].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar83;
      pmVar31->value[1].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar83 >> 0x20);
      uVar9 = pmVar31->value[2].field_0;
      uVar26 = pmVar31->value[2].field_1;
      uVar10 = pmVar31->value[2].field_2;
      uVar27 = pmVar31->value[2].field_3;
      auVar94._0_4_ = fVar72 * (float)uVar9;
      auVar94._4_4_ = fVar72 * (float)uVar26;
      auVar94._8_4_ = fVar72 * 0.0;
      auVar94._12_4_ = fVar72 * 0.0;
      auVar100._0_4_ = fVar72 * (float)uVar10;
      auVar100._4_4_ = fVar72 * (float)uVar27;
      auVar100._8_4_ = fVar72 * 0.0;
      auVar100._12_4_ = fVar72 * 0.0;
      uVar83 = vmovlps_avx(auVar94);
      pmVar31->value[2].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar83;
      pmVar31->value[2].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar83 >> 0x20);
      uVar83 = vmovlps_avx(auVar100);
      pmVar31->value[2].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar83;
      pmVar31->value[2].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar83 >> 0x20);
      uVar11 = pmVar31->value[3].field_0;
      uVar28 = pmVar31->value[3].field_1;
      uVar12 = pmVar31->value[3].field_2;
      uVar29 = pmVar31->value[3].field_3;
      auVar95._0_4_ = fVar72 * (float)uVar11;
      auVar95._4_4_ = fVar72 * (float)uVar28;
      auVar95._8_4_ = fVar72 * 0.0;
      auVar95._12_4_ = fVar72 * 0.0;
      auVar79._0_4_ = fVar72 * (float)uVar12;
      auVar79._4_4_ = fVar72 * (float)uVar29;
      auVar79._8_4_ = fVar72 * 0.0;
      auVar79._12_4_ = fVar72 * 0.0;
      uVar83 = vmovlps_avx(auVar95);
      pmVar31->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar83;
      pmVar31->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar83 >> 0x20);
      uVar83 = vmovlps_avx(auVar79);
      pmVar31->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar83;
      pmVar31->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar83 >> 0x20);
      pmVar31 = this->T;
      pmVar31->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0;
      pmVar31->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1;
      pmVar31->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2;
      pmVar31->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<1UL,_float,_false>._M_head_impl;
      pPVar32 = this->Tpers;
      local_c8._0_16_ = auVar90;
      if (pPVar32 != (PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)0x0) {
        pmVar53 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&detail::persistentCache_glmmat4,&pPVar32->name);
        aVar36 = (pPVar32->value).value[0].field_1;
        aVar37 = (pPVar32->value).value[0].field_2;
        aVar38 = (pPVar32->value).value[0].field_3;
        aVar39 = (pPVar32->value).value[1].field_0;
        aVar40 = (pPVar32->value).value[1].field_1;
        aVar41 = (pPVar32->value).value[1].field_2;
        aVar42 = (pPVar32->value).value[1].field_3;
        aVar43 = (pPVar32->value).value[2].field_0;
        aVar44 = (pPVar32->value).value[2].field_1;
        aVar45 = (pPVar32->value).value[2].field_2;
        aVar46 = (pPVar32->value).value[2].field_3;
        aVar47 = (pPVar32->value).value[3].field_0;
        aVar48 = (pPVar32->value).value[3].field_1;
        aVar49 = (pPVar32->value).value[3].field_2;
        aVar50 = (pPVar32->value).value[3].field_3;
        pmVar53->value[0].field_0 = (pPVar32->value).value[0].field_0;
        pmVar53->value[0].field_1 = aVar36;
        pmVar53->value[0].field_2 = aVar37;
        pmVar53->value[0].field_3 = aVar38;
        pmVar53->value[1].field_0 = aVar39;
        pmVar53->value[1].field_1 = aVar40;
        pmVar53->value[1].field_2 = aVar41;
        pmVar53->value[1].field_3 = aVar42;
        pmVar53->value[2].field_0 = aVar43;
        pmVar53->value[2].field_1 = aVar44;
        pmVar53->value[2].field_2 = aVar45;
        pmVar53->value[2].field_3 = aVar46;
        pmVar53->value[3].field_0 = aVar47;
        pmVar53->value[3].field_1 = aVar48;
        pmVar53->value[3].field_2 = aVar49;
        pmVar53->value[3].field_3 = aVar50;
        pPVar32->holdsDefaultValue = false;
      }
      requestRedraw();
      uVar83 = vmovlps_avx(local_c8._0_16_);
      (this->dragPrevVec).field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar83;
      (this->dragPrevVec).field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar83 >> 0x20);
    }
    else {
      if (TVar30 == Translation) {
        raySource_02.field_1 = aStack_94;
        raySource_02.field_0 = local_98;
        raySource_02.field_2 = raySource.field_2;
        center_03.field_2.z = (float)local_c8._0_4_;
        center_03.field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_f8._0_4_;
        center_03.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_f8._4_4_;
        tangent_00.field_2 = (&local_68)[(long)this->selectedDim * 3];
        tangent_00._0_8_ = *(undefined8 *)((long)&local_70 + (long)this->selectedDim * 0xc);
        lineTest(&local_118,in_RSI,raySource_02,vVar133,center_03,tangent_00,INFINITY);
        if (INFINITY <=
            local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
            super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
            super__Head_base<1UL,_float,_false>._M_head_impl) goto LAB_00235fa2;
        register0x00001288 = 0;
        local_d8 = (undefined1  [4])
                   local_118.
                   super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                   super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
                   field_0;
        auStack_d4 = (undefined1  [4])
                     local_118.
                     super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                     super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                     super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                     super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>.
                     _M_head_impl.field_1;
        uVar3 = (this->dragPrevVec).field_0;
        uVar20 = (this->dragPrevVec).field_1;
        auVar88._4_4_ = uVar20;
        auVar88._0_4_ = uVar3;
        auVar88._8_8_ = 0;
        uVar4 = pmVar31->value[3].field_0;
        uVar21 = pmVar31->value[3].field_1;
        auVar58 = vsubps_avx(_local_d8,auVar88);
        local_f8._0_4_ =
             local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
             field_2;
        fVar72 = (this->dragPrevVec).field_2.z;
        auVar89._0_4_ = auVar58._0_4_ + (float)uVar4;
        auVar89._4_4_ = auVar58._4_4_ + (float)uVar21;
        auVar89._8_4_ = auVar58._8_4_ + 0.0;
        auVar89._12_4_ = auVar58._12_4_ + 0.0;
        uVar83 = vmovlps_avx(auVar89);
        pmVar31->value[3].field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar83;
        pmVar31->value[3].field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
             (int)((ulong)uVar83 >> 0x20);
        pmVar31->value[3].field_2.z =
             (local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>
              .super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
              super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
              super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
              field_2.z - fVar72) + pmVar31->value[3].field_2.z;
        pPVar32 = this->Tpers;
        if (pPVar32 != (PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)0x0) {
          pmVar53 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&detail::persistentCache_glmmat4,&pPVar32->name);
          aVar36 = (pPVar32->value).value[0].field_1;
          aVar37 = (pPVar32->value).value[0].field_2;
          aVar38 = (pPVar32->value).value[0].field_3;
          aVar39 = (pPVar32->value).value[1].field_0;
          aVar40 = (pPVar32->value).value[1].field_1;
          aVar41 = (pPVar32->value).value[1].field_2;
          aVar42 = (pPVar32->value).value[1].field_3;
          aVar43 = (pPVar32->value).value[2].field_0;
          aVar44 = (pPVar32->value).value[2].field_1;
          aVar45 = (pPVar32->value).value[2].field_2;
          aVar46 = (pPVar32->value).value[2].field_3;
          aVar47 = (pPVar32->value).value[3].field_0;
          aVar48 = (pPVar32->value).value[3].field_1;
          aVar49 = (pPVar32->value).value[3].field_2;
          aVar50 = (pPVar32->value).value[3].field_3;
          pmVar53->value[0].field_0 = (pPVar32->value).value[0].field_0;
          pmVar53->value[0].field_1 = aVar36;
          pmVar53->value[0].field_2 = aVar37;
          pmVar53->value[0].field_3 = aVar38;
          pmVar53->value[1].field_0 = aVar39;
          pmVar53->value[1].field_1 = aVar40;
          pmVar53->value[1].field_2 = aVar41;
          pmVar53->value[1].field_3 = aVar42;
          pmVar53->value[2].field_0 = aVar43;
          pmVar53->value[2].field_1 = aVar44;
          pmVar53->value[2].field_2 = aVar45;
          pmVar53->value[2].field_3 = aVar46;
          pmVar53->value[3].field_0 = aVar47;
          pmVar53->value[3].field_1 = aVar48;
          pmVar53->value[3].field_2 = aVar49;
          pmVar53->value[3].field_3 = aVar50;
          pPVar32->holdsDefaultValue = false;
        }
        requestRedraw();
        goto LAB_00235d8f;
      }
      if (TVar30 != Rotation) goto LAB_00235fa2;
      raySource.field_1 = aStack_94;
      raySource.field_0 = local_98;
      uVar55 = *(ulong *)((long)&local_70 + (long)this->selectedDim * 0xc);
      aVar73 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)
               (&local_68)[(long)this->selectedDim * 3].z;
      unique0x10002065 = 0;
      _local_d8 = uVar55;
      center.field_2.z = (float)local_c8._0_4_;
      center.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_f8._0_4_;
      center.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_f8._4_4_;
      normal.field_2.z = (float)aVar73;
      normal.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar55;
      normal.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)(uVar55 >> 0x20);
      circleTest(&local_118,in_RSI,raySource,vVar133,center,normal,local_ac - local_dc);
      if (INFINITY <=
          local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Head_base<1UL,_float,_false>._M_head_impl) goto LAB_00235fa2;
      auVar74._8_8_ = 0;
      auVar74._0_4_ =
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0;
      auVar74._4_4_ =
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1;
      auVar58 = vsubps_avx(auVar74,local_f8);
      fVar84 = local_118.
               super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
               super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
               super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
               super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
               field_2.z - (float)local_c8._0_4_;
      fVar81 = auVar58._0_4_;
      auVar97._0_4_ = fVar81 * fVar81;
      fVar96 = auVar58._4_4_;
      auVar97._4_4_ = fVar96 * fVar96;
      fVar33 = auVar58._8_4_;
      auVar97._8_4_ = fVar33 * fVar33;
      fVar82 = auVar58._12_4_;
      auVar97._12_4_ = fVar82 * fVar82;
      auVar58 = vhaddps_avx(auVar97,auVar97);
      auVar58 = ZEXT416((uint)(auVar58._0_4_ + fVar84 * fVar84));
      auVar58 = vsqrtss_avx(auVar58,auVar58);
      fVar111 = 1.0 / auVar58._0_4_;
      fVar84 = fVar84 * fVar111;
      fVar72 = (this->dragPrevVec).field_1.y;
      fVar71 = (this->dragPrevVec).field_0.x;
      local_f8._0_4_ = fVar81 * fVar111;
      local_f8._4_4_ = fVar96 * fVar111;
      local_f8._8_4_ = fVar33 * fVar111;
      local_f8._12_4_ = fVar82 * fVar111;
      fVar81 = (this->dragPrevVec).field_2.z;
      local_c8._0_4_ = fVar84;
      auVar58 = vmovshdup_avx(local_f8);
      auVar59 = vfmsub231ss_fma(ZEXT416((uint)(fVar81 * auVar58._0_4_)),ZEXT416((uint)fVar72),
                                ZEXT416((uint)fVar84));
      auVar58 = vfmsub231ss_fma(ZEXT416((uint)(fVar72 * (float)local_f8._0_4_)),
                                ZEXT416((uint)fVar71),auVar58);
      auVar60 = vfmsub231ss_fma(ZEXT416((uint)(fVar71 * fVar84)),local_f8,ZEXT416((uint)fVar81));
      local_88 = vmovshdup_avx(_local_d8);
      auVar58 = vmaxss_avx(SUB6416(ZEXT464(0xbf800000),0),
                           ZEXT416((uint)(auVar58._0_4_ * aVar73.z +
                                         local_d8 * auVar59._0_4_ + local_88._0_4_ * auVar60._0_4_))
                          );
      auVar58 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar58);
      fVar72 = asinf(auVar58._0_4_);
      pmVar31 = this->T;
      local_a8 = CONCAT44(local_a8._4_4_,fVar72);
      local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
            &pmVar31->value[3].field_0;
      local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)
            &pmVar31->value[3].field_1;
      local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
           *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
            &pmVar31->value[3].field_2;
      local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<1UL,_float,_false>._M_head_impl = *(float *)&pmVar31->value[3].field_3;
      pmVar31->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
      pmVar31->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
      pmVar31->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
      pmVar31->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
      local_98.x = cosf(fVar72);
      aStack_94 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)extraout_XMM0_Db;
      uStack_90 = extraout_XMM0_Dc;
      uStack_8c = extraout_XMM0_Dd;
      auVar80._0_4_ = sinf((float)local_a8);
      auVar80._4_60_ = extraout_var;
      auVar34._8_4_ = 0x80000000;
      auVar34._0_8_ = 0x8000000080000000;
      auVar34._12_4_ = 0x80000000;
      auVar58 = vxorps_avx512vl(auVar80._0_16_,auVar34);
      pmVar31 = this->T;
      fVar72 = pmVar31->value[0].field_3.w;
      auVar35._4_4_ = aStack_94;
      auVar35._0_4_ = local_98;
      auVar35._8_4_ = uStack_90;
      auVar35._12_4_ = uStack_8c;
      auVar59 = ZEXT416((uint)(aVar73.z * aVar73.z +
                              (float)local_d8 * (float)local_d8 +
                              (float)local_88._0_4_ * (float)local_88._0_4_));
      auVar59 = vsqrtss_avx(auVar59,auVar59);
      auVar58 = vinsertps_avx(auVar80._0_16_,auVar58,0x10);
      fVar96 = 1.0 - local_98.x;
      fVar81 = 1.0 / auVar59._0_4_;
      fVar71 = aVar73.z * fVar81;
      auVar106._0_4_ = (float)local_d8 * fVar81;
      auVar106._4_4_ = (float)auStack_d4 * fVar81;
      auVar106._8_4_ = (float)auStack_d0._0_4_ * fVar81;
      auVar106._12_4_ = (float)auStack_d0._4_4_ * fVar81;
      auVar122._4_4_ = fVar71;
      auVar122._0_4_ = fVar71;
      auVar122._8_4_ = fVar71;
      auVar122._12_4_ = fVar71;
      fVar81 = fVar71 * fVar96;
      auVar59 = vbroadcastss_avx512vl(auVar35);
      auVar121._0_4_ = fVar71 * auVar58._0_4_;
      auVar121._4_4_ = fVar71 * auVar58._4_4_;
      auVar121._8_4_ = fVar71 * auVar58._8_4_;
      auVar121._12_4_ = fVar71 * auVar58._12_4_;
      auVar60 = vshufps_avx512vl(auVar106,auVar106,0xe1);
      auVar58 = vshufps_avx(auVar58,auVar58,0xe1);
      auVar108._0_4_ = auVar106._0_4_ * fVar96;
      auVar108._4_4_ = auVar106._4_4_ * fVar96;
      auVar108._8_4_ = auVar106._8_4_ * fVar96;
      auVar108._12_4_ = auVar106._12_4_ * fVar96;
      auVar61 = vmulps_avx512vl(auVar60,auVar58);
      auVar75._0_4_ = auVar106._0_4_ * auVar58._0_4_;
      auVar75._4_4_ = auVar106._4_4_ * auVar58._4_4_;
      auVar75._8_4_ = auVar106._8_4_ * auVar58._8_4_;
      auVar75._12_4_ = auVar106._12_4_ * auVar58._12_4_;
      auVar63 = vfmadd213ss_fma(ZEXT416((uint)fVar71),ZEXT416((uint)fVar81),auVar35);
      auVar118._4_4_ = fVar81;
      auVar118._0_4_ = fVar81;
      auVar118._8_4_ = fVar81;
      auVar118._12_4_ = fVar81;
      auVar67 = ZEXT816(0) << 0x20;
      fVar81 = fVar72 * 0.0;
      auVar79 = ZEXT416((uint)pmVar31->value[2].field_3);
      auVar64 = vmulss_avx512f(auVar79,auVar67);
      auVar58 = vfmadd231ps_avx512vl(auVar121,auVar108,auVar60);
      auVar65 = vfmadd231ps_avx512vl(auVar59,auVar108,auVar106);
      auVar69 = ZEXT416((uint)pmVar31->value[1].field_3);
      auVar62 = vmulss_avx512f(auVar69,auVar67);
      auVar66 = vfmadd213ps_avx512vl(auVar118,auVar60,auVar75);
      auVar59 = vfmadd231ps_fma(auVar61,auVar108,auVar122);
      fVar71 = auVar63._0_4_ * 0.0;
      auVar129._4_4_ = fVar81;
      auVar129._0_4_ = fVar81;
      auVar129._8_4_ = fVar81;
      auVar129._12_4_ = fVar81;
      auVar90 = ZEXT416((uint)pmVar31->value[3].field_3);
      auVar67 = vmulss_avx512f(auVar90,auVar67);
      auVar68 = vbroadcastss_avx512vl(auVar62);
      auVar123._0_4_ = auVar58._0_4_ * 0.0;
      auVar123._4_4_ = auVar58._4_4_ * 0.0;
      auVar123._8_4_ = auVar58._8_4_ * 0.0;
      auVar123._12_4_ = auVar58._12_4_ * 0.0;
      auVar60 = vmulps_avx512vl(auVar65,ZEXT416(0) << 0x20);
      auVar112._0_4_ = auVar66._0_4_ * 0.0;
      auVar112._4_4_ = auVar66._4_4_ * 0.0;
      auVar112._8_4_ = auVar66._8_4_ * 0.0;
      auVar112._12_4_ = auVar66._12_4_ * 0.0;
      auVar85._0_4_ = auVar59._0_4_ * 0.0;
      auVar85._4_4_ = auVar59._4_4_ * 0.0;
      auVar85._8_4_ = auVar59._8_4_ * 0.0;
      auVar85._12_4_ = auVar59._12_4_ * 0.0;
      auVar62 = vinsertps_avx512f(auVar68,auVar69,0x10);
      auVar65 = vaddps_avx512vl(auVar65,auVar123);
      auVar69 = vaddps_avx512vl(auVar58,auVar60);
      auVar70 = vaddps_avx512vl(auVar60,auVar123);
      uVar15._0_4_ = pmVar31->value[2].field_0;
      uVar15._4_4_ = pmVar31->value[2].field_1;
      uVar2 = pmVar31->value[3].field_0;
      uVar19 = pmVar31->value[3].field_1;
      auVar61 = vshufps_avx(auVar112,auVar112,0xe1);
      auVar60 = vhaddps_avx(auVar112,auVar112);
      auVar119._4_4_ = fVar71;
      auVar119._0_4_ = fVar71;
      auVar119._8_4_ = fVar71;
      auVar119._12_4_ = fVar71;
      auVar58 = vblendps_avx(auVar85,auVar59,2);
      auVar107._0_4_ = auVar85._0_4_ + auVar69._0_4_;
      auVar107._4_4_ = auVar85._4_4_ + auVar69._4_4_;
      auVar107._8_4_ = auVar85._8_4_ + auVar69._8_4_;
      auVar107._12_4_ = auVar85._12_4_ + auVar69._12_4_;
      auVar109._0_4_ = auVar85._0_4_ + auVar65._0_4_;
      auVar109._4_4_ = auVar85._4_4_ + auVar65._4_4_;
      auVar109._8_4_ = auVar85._8_4_ + auVar65._8_4_;
      auVar109._12_4_ = auVar85._12_4_ + auVar65._12_4_;
      auVar59 = vblendps_avx(auVar59,auVar85,2);
      auVar128._0_4_ = auVar58._0_4_ + auVar70._0_4_;
      auVar128._4_4_ = auVar58._4_4_ + auVar70._4_4_;
      auVar128._8_4_ = auVar58._8_4_ + auVar70._8_4_;
      auVar128._12_4_ = auVar58._12_4_ + auVar70._12_4_;
      auVar58 = vinsertps_avx(auVar119,auVar63,0x10);
      auVar86._0_4_ = auVar70._0_4_ + auVar59._0_4_;
      auVar86._4_4_ = auVar70._4_4_ + auVar59._4_4_;
      auVar86._8_4_ = auVar70._8_4_ + auVar59._8_4_;
      auVar86._12_4_ = auVar70._12_4_ + auVar59._12_4_;
      fVar96 = auVar60._0_4_;
      auVar76._0_4_ = fVar71 + auVar66._0_4_ + auVar61._0_4_;
      auVar76._4_4_ = fVar71 + auVar66._4_4_ + auVar61._4_4_;
      auVar76._8_4_ = fVar71 + auVar66._8_4_ + auVar61._8_4_;
      auVar76._12_4_ = fVar71 + auVar66._12_4_ + auVar61._12_4_;
      auVar120._0_4_ = fVar96 + auVar58._0_4_;
      auVar120._4_4_ = fVar96 + auVar58._4_4_;
      auVar120._8_4_ = fVar96 + auVar58._8_4_;
      auVar120._12_4_ = fVar96 + auVar58._12_4_;
      uVar16._0_4_ = pmVar31->value[0].field_0;
      uVar16._4_4_ = pmVar31->value[0].field_1;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = uVar16;
      fVar71 = pmVar31->value[0].field_2.z;
      auVar113._4_4_ = fVar71;
      auVar113._0_4_ = fVar71;
      auVar113._8_4_ = fVar71;
      auVar113._12_4_ = fVar71;
      auVar59 = vshufps_avx(auVar76,auVar76,0xe1);
      auVar58 = vmulps_avx512vl(auVar102,auVar107);
      auVar60 = vmulps_avx512vl(auVar102,auVar109);
      auVar124._0_4_ = fVar71 * auVar59._0_4_;
      auVar124._4_4_ = fVar71 * auVar59._4_4_;
      auVar124._8_4_ = fVar71 * auVar59._8_4_;
      auVar124._12_4_ = fVar71 * auVar59._12_4_;
      auVar58 = vshufps_avx512vl(auVar58,auVar58,0xe1);
      auVar58 = vaddps_avx512vl(auVar58,auVar60);
      auVar58 = vaddps_avx512vl(auVar124,auVar58);
      auVar60 = vmulps_avx512vl(auVar102,auVar128);
      auVar103._0_4_ = (float)(undefined4)uVar16 * auVar86._0_4_;
      auVar103._4_4_ = (float)uVar16._4_4_ * auVar86._4_4_;
      auVar103._8_4_ = auVar86._8_4_ * 0.0;
      auVar103._12_4_ = auVar86._12_4_ * 0.0;
      auVar60 = vshufps_avx512vl(auVar60,auVar60,0xe1);
      auVar125._0_4_ = fVar81 + auVar58._0_4_;
      auVar125._4_4_ = fVar81 + auVar58._4_4_;
      auVar125._8_4_ = fVar81 + auVar58._8_4_;
      auVar125._12_4_ = fVar81 + auVar58._12_4_;
      auVar60 = vaddps_avx512vl(auVar60,auVar103);
      auVar61 = vshufps_avx512vl(auVar120,auVar120,0xe1);
      auVar63 = vmulps_avx512vl(auVar113,auVar61);
      auVar58 = vinsertps_avx(auVar129,ZEXT416((uint)fVar72),0x10);
      fVar72 = pmVar31->value[1].field_2.z;
      auVar126._4_4_ = fVar72;
      auVar126._0_4_ = fVar72;
      auVar126._8_4_ = fVar72;
      auVar126._12_4_ = fVar72;
      auVar104._0_4_ = auVar58._0_4_ + auVar63._0_4_ + auVar60._0_4_;
      auVar104._4_4_ = auVar58._4_4_ + auVar63._4_4_ + auVar60._4_4_;
      auVar104._8_4_ = auVar58._8_4_ + auVar63._8_4_ + auVar60._8_4_;
      auVar104._12_4_ = auVar58._12_4_ + auVar63._12_4_ + auVar60._12_4_;
      uVar17._0_4_ = pmVar31->value[1].field_0;
      uVar17._4_4_ = pmVar31->value[1].field_1;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = uVar17;
      auVar130._0_4_ = auVar59._0_4_ * fVar72;
      auVar130._4_4_ = auVar59._4_4_ * fVar72;
      auVar130._8_4_ = auVar59._8_4_ * fVar72;
      auVar130._12_4_ = auVar59._12_4_ * fVar72;
      auVar58 = vmulps_avx512vl(auVar61,auVar126);
      auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar31->value[2].field_2));
      auVar61 = vmulps_avx512vl(auVar107,auVar114);
      auVar63 = vmulps_avx512vl(auVar109,auVar114);
      auVar61 = vshufps_avx512vl(auVar61,auVar61,0xe1);
      auVar61 = vaddps_avx512vl(auVar61,auVar63);
      auVar61 = vaddps_avx512vl(auVar61,auVar130);
      auVar63 = vmulps_avx512vl(auVar128,auVar114);
      auVar115._0_4_ = (float)(undefined4)uVar17 * auVar86._0_4_;
      auVar115._4_4_ = (float)uVar17._4_4_ * auVar86._4_4_;
      auVar115._8_4_ = auVar86._8_4_ * 0.0;
      auVar115._12_4_ = auVar86._12_4_ * 0.0;
      auVar63 = vshufps_avx512vl(auVar63,auVar63,0xe1);
      auVar61 = vaddps_avx512vl(auVar61,auVar68);
      auVar63 = vaddps_avx512vl(auVar63,auVar115);
      auVar131._8_8_ = 0;
      auVar131._0_8_ = uVar15;
      auVar65 = vmulps_avx512vl(auVar86,auVar131);
      auVar87._0_4_ = (float)uVar2 * auVar86._0_4_;
      auVar87._4_4_ = (float)uVar19 * auVar86._4_4_;
      auVar87._8_4_ = auVar86._8_4_ * 0.0;
      auVar87._12_4_ = auVar86._12_4_ * 0.0;
      auVar105._0_4_ = auVar63._0_4_ + auVar58._0_4_ + auVar62._0_4_;
      auVar105._4_4_ = auVar63._4_4_ + auVar58._4_4_ + auVar62._4_4_;
      auVar105._8_4_ = auVar63._8_4_ + auVar58._8_4_ + auVar62._8_4_;
      auVar105._12_4_ = auVar63._12_4_ + auVar58._12_4_ + auVar62._12_4_;
      auVar62 = vmulps_avx512vl(auVar128,auVar131);
      auVar58 = vshufps_avx(auVar65,auVar65,0xe1);
      auVar63 = vmulps_avx512vl(auVar120,auVar60);
      auVar116._0_4_ = auVar62._0_4_ + auVar58._0_4_ + auVar63._0_4_;
      auVar116._4_4_ = auVar62._4_4_ + auVar58._4_4_ + auVar63._4_4_;
      auVar116._8_4_ = auVar62._8_4_ + auVar58._8_4_ + auVar63._8_4_;
      auVar116._12_4_ = auVar62._12_4_ + auVar58._12_4_ + auVar63._12_4_;
      auVar62 = vmulps_avx512vl(auVar59,auVar60);
      auVar132._8_8_ = 0;
      auVar132._0_8_ = uVar15;
      auVar58 = vmulps_avx512vl(auVar107,auVar132);
      auVar63 = vmulps_avx512vl(auVar109,auVar132);
      auVar110._0_4_ = (float)uVar2 * auVar109._0_4_;
      auVar110._4_4_ = (float)uVar19 * auVar109._4_4_;
      auVar110._8_4_ = auVar109._8_4_ * 0.0;
      auVar110._12_4_ = auVar109._12_4_ * 0.0;
      auVar58 = vshufps_avx(auVar58,auVar58,0xe1);
      auVar59 = vshufps_avx(auVar116,auVar116,0xe1);
      auVar60 = vshufps_avx(auVar110,auVar110,0xe1);
      auVar63 = vaddps_avx512vl(auVar58,auVar63);
      auVar64 = vbroadcastss_avx512vl(auVar64);
      auVar58 = vinsertps_avx512f(auVar64,auVar79,0x1c);
      auVar101._0_4_ = auVar59._0_4_ + auVar58._0_4_;
      auVar101._4_4_ = auVar59._4_4_ + auVar58._4_4_;
      auVar101._8_4_ = auVar59._8_4_ + auVar58._8_4_;
      auVar101._12_4_ = auVar59._12_4_ + auVar58._12_4_;
      auVar117._0_4_ = auVar128._0_4_ * (float)uVar2;
      auVar117._4_4_ = auVar128._4_4_ * (float)uVar19;
      auVar117._8_4_ = auVar128._8_4_ * 0.0;
      auVar117._12_4_ = auVar128._12_4_ * 0.0;
      auVar127._0_4_ = auVar63._0_4_ + auVar62._0_4_;
      auVar127._4_4_ = auVar63._4_4_ + auVar62._4_4_;
      auVar127._8_4_ = auVar63._8_4_ + auVar62._8_4_;
      auVar127._12_4_ = auVar63._12_4_ + auVar62._12_4_;
      auVar58 = vmovshdup_avx(auVar117);
      auVar62 = vaddps_avx512vl(auVar127,auVar64);
      auVar59 = vmovshdup_avx(auVar87);
      fVar72 = pmVar31->value[3].field_2.z;
      uVar83 = vmovlps_avx(auVar125);
      pmVar31->value[0].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar83;
      pmVar31->value[0].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar83 >> 0x20);
      uVar83 = vmovlps_avx(auVar104);
      pmVar31->value[0].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar83;
      pmVar31->value[0].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar83 >> 0x20);
      uVar83 = vmovlps_avx(auVar61);
      pmVar31->value[1].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar83;
      pmVar31->value[1].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar83 >> 0x20);
      uVar83 = vmovlps_avx(auVar105);
      pmVar31->value[1].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar83;
      pmVar31->value[1].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar83 >> 0x20);
      uVar83 = vmovlps_avx(auVar62);
      pmVar31->value[2].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar83;
      pmVar31->value[2].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar83 >> 0x20);
      uVar83 = vmovlps_avx(auVar101);
      pmVar31->value[2].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar83;
      pmVar31->value[2].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar83 >> 0x20);
      auVar77._0_4_ = (float)uVar2 * auVar107._0_4_ + auVar60._0_4_ + fVar72 * auVar76._0_4_;
      auVar77._4_4_ = (float)uVar19 * auVar107._4_4_ + auVar60._4_4_ + fVar72 * auVar76._4_4_;
      auVar77._8_4_ = auVar107._8_4_ * 0.0 + auVar60._8_4_ + fVar72 * auVar76._8_4_;
      auVar77._12_4_ = auVar107._12_4_ * 0.0 + auVar60._12_4_ + fVar72 * auVar76._12_4_;
      auVar60 = vmovshdup_avx(auVar120);
      auVar61 = vshufps_avx(auVar77,auVar77,0xe1);
      fVar71 = auVar67._0_4_;
      auVar78._0_4_ = auVar61._0_4_ + fVar71;
      auVar78._4_4_ = auVar61._4_4_ + fVar71;
      auVar78._8_4_ = auVar61._8_4_ + fVar71;
      auVar78._12_4_ = auVar61._12_4_ + fVar71;
      auVar59 = vaddss_avx512f(auVar90,ZEXT416((uint)(auVar117._0_4_ + auVar59._0_4_ +
                                                     auVar120._0_4_ * fVar72)));
      uVar83 = vmovlps_avx(auVar78);
      pmVar31->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar83;
      pmVar31->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar83 >> 0x20);
      auVar58 = vinsertps_avx(ZEXT416((uint)(auVar87._0_4_ + auVar58._0_4_ + fVar72 * auVar60._0_4_
                                            + fVar71)),auVar59,0x10);
      uVar83 = vmovlps_avx(auVar58);
      pmVar31->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar83;
      pmVar31->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar83 >> 0x20);
      pmVar31 = this->T;
      pmVar31->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0;
      pmVar31->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1;
      pmVar31->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2;
      pmVar31->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           local_118.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<1UL,_float,_false>._M_head_impl;
      pPVar32 = this->Tpers;
      if (pPVar32 != (PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)0x0) {
        pmVar53 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&detail::persistentCache_glmmat4,&pPVar32->name);
        aVar36 = (pPVar32->value).value[0].field_1;
        aVar37 = (pPVar32->value).value[0].field_2;
        aVar38 = (pPVar32->value).value[0].field_3;
        aVar39 = (pPVar32->value).value[1].field_0;
        aVar40 = (pPVar32->value).value[1].field_1;
        aVar41 = (pPVar32->value).value[1].field_2;
        aVar42 = (pPVar32->value).value[1].field_3;
        aVar43 = (pPVar32->value).value[2].field_0;
        aVar44 = (pPVar32->value).value[2].field_1;
        aVar45 = (pPVar32->value).value[2].field_2;
        aVar46 = (pPVar32->value).value[2].field_3;
        aVar47 = (pPVar32->value).value[3].field_0;
        aVar48 = (pPVar32->value).value[3].field_1;
        aVar49 = (pPVar32->value).value[3].field_2;
        aVar50 = (pPVar32->value).value[3].field_3;
        pmVar53->value[0].field_0 = (pPVar32->value).value[0].field_0;
        pmVar53->value[0].field_1 = aVar36;
        pmVar53->value[0].field_2 = aVar37;
        pmVar53->value[0].field_3 = aVar38;
        pmVar53->value[1].field_0 = aVar39;
        pmVar53->value[1].field_1 = aVar40;
        pmVar53->value[1].field_2 = aVar41;
        pmVar53->value[1].field_3 = aVar42;
        pmVar53->value[2].field_0 = aVar43;
        pmVar53->value[2].field_1 = aVar44;
        pmVar53->value[2].field_2 = aVar45;
        pmVar53->value[2].field_3 = aVar46;
        pmVar53->value[3].field_0 = aVar47;
        pmVar53->value[3].field_1 = aVar48;
        pmVar53->value[3].field_2 = aVar49;
        pmVar53->value[3].field_3 = aVar50;
        pPVar32->holdsDefaultValue = false;
      }
      requestRedraw();
      uVar83 = vmovlps_avx(local_f8);
      (this->dragPrevVec).field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar83;
      (this->dragPrevVec).field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar83 >> 0x20);
      aVar73 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_c8._0_4_;
    }
  }
  (this->dragPrevVec).field_2 = aVar73;
LAB_00235fa2:
  return (bool)((byte)uVar57 | this->currentlyDragging);
}

Assistant:

bool TransformationGizmo::interact() {
  if (!enabled.get()) return false;

  ImGuiIO& io = ImGui::GetIO();

  // end a drag, if needed
  bool draggingAtStart = currentlyDragging;
  if (currentlyDragging && (!ImGui::IsMouseDown(0) || !ImGui::IsMousePosValid())) {
    currentlyDragging = false;
  }

  // Get the mouse ray in world space
  glm::vec3 raySource = view::getCameraWorldPosition();
  glm::vec2 mouseCoords{io.MousePos.x, io.MousePos.y};
  glm::vec3 ray = view::screenCoordsToWorldRay(mouseCoords);

  // Get data about the widget
  // (there are much more efficient ways to do this)
  glm::vec3 center(T * glm::vec4{0., 0., 0., 1.});
  glm::vec3 nX(T * glm::vec4{1., 0., 0., 0.});
  glm::vec3 nY(T * glm::vec4{0., 1., 0., 0.});
  glm::vec3 nZ(T * glm::vec4{0., 0., 1., 0.});
  std::array<glm::vec3, 3> axNormals{glm::normalize(nX), glm::normalize(nY), glm::normalize(nZ)};

  float transScale = glm::length(glm::vec3(T[0]));
  float gizmoSize = transScale * gizmoSizeRel * state::lengthScale;
  float diskRad = gizmoSize; // size 1
  float diskWidth = gizmoSize * diskWidthObj;

  if (currentlyDragging) {

    if (selectedType == TransformHandle::Rotation) {

      // Cast against the axis we are currently rotating
      glm::vec3 normal = axNormals[selectedDim];
      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = circleTest(raySource, ray, center, normal, diskRad - diskWidth);

      if (dist != std::numeric_limits<float>::infinity()) {
        // if a collinear line (etc) causes an inf dist, just don't process

        // Compute the new nearest normal to the drag
        glm::vec3 nearestDir = glm::normalize(nearestPoint - center);
        float arg = glm::dot(normal, glm::cross(dragPrevVec, nearestDir));
        arg = glm::clamp(arg, -1.f, 1.f);
        float angle = std::asin(arg); // could be fancier with atan, but that's fine

        // Split, transform, and recombine
        glm::vec4 trans(T[3]);
        T[3] = glm::vec4{0., 0., 0., 1.};
        // T.get() = glm::translate(glm::rotate(angle, normal) * glm::translate(T.get(), -trans), trans);
        T = glm::rotate(angle, normal) * T;
        T[3] = trans;
        markUpdated();
        polyscope::requestRedraw();

        dragPrevVec = nearestDir; // store this dir for the next time around
      }
    } else if (selectedType == TransformHandle::Translation) {

      // Cast against the axis we are currently translating

      glm::vec3 normal = axNormals[selectedDim];
      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) =
          lineTest(raySource, ray, center, normal, std::numeric_limits<float>::infinity());

      if (dist != std::numeric_limits<float>::infinity()) {
        // if a collinear line (etc) causes an inf dist, just don't process

        // Split, transform, and recombine
        glm::vec3 trans = nearestPoint - dragPrevVec;
        T[3][0] += trans.x;
        T[3][1] += trans.y;
        T[3][2] += trans.z;
        markUpdated();
        polyscope::requestRedraw();

        dragPrevVec = nearestPoint; // store this dir for the next time around
      }

    } else if (selectedType == TransformHandle::Scale) {

      // Cast against the scale sphere

      float dist, tHit;
      glm::vec3 nearestPoint;
      float worldSphereRad = sphereRad * gizmoSize;
      std::tie(tHit, dist, nearestPoint) = sphereTest(raySource, ray, center, worldSphereRad, false);

      if (dist != std::numeric_limits<float>::infinity()) {
        // if a collinear line (etc) causes an inf dist, just don't process

        float newWorldRad = glm::length(nearestPoint - center);
        float scaleRatio = newWorldRad / worldSphereRad;

        // Split, transform, and recombine
        glm::vec4 trans(T[3]);
        T[3] = glm::vec4{0., 0., 0., 1.};
        T *= scaleRatio;
        T[3] = trans;
        markUpdated();
        polyscope::requestRedraw();

        dragPrevVec = nearestPoint; // store this dir for the next time around
      }
    }
  } else /* !currentlyDragging */ {

    // == Find the part of the widget that we are closest to

    float firstHit = std::numeric_limits<float>::infinity();
    float hitDist = std::numeric_limits<float>::infinity();
    int hitDim = -1;
    TransformHandle hitType = TransformHandle::None;
    glm::vec3 hitNearest(0., 0., 0.);

    // Test the three rotation directions
    for (int dim = 0; dim < 3; dim++) {

      glm::vec3 normal = axNormals[dim];

      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = circleTest(raySource, ray, center, normal, diskRad - diskWidth);

      if (dist < diskWidth && tHit < firstHit) {
        firstHit = tHit;
        hitDist = dist;
        hitDim = dim;
        hitType = TransformHandle::Rotation;
        hitNearest = nearestPoint;
      }
    }

    // Test the three translation directions
    for (int dim = 0; dim < 3; dim++) {

      glm::vec3 normal = axNormals[dim];

      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = lineTest(raySource, ray, center, normal, vecLength * gizmoSize);
      tHit -= diskWidth; // pull the hit outward, hackily simulates cylinder radius

      if (dist < diskWidth && tHit < firstHit) {
        firstHit = tHit;
        hitDist = dist;
        hitDim = dim;
        hitType = TransformHandle::Translation;
        hitNearest = nearestPoint;
      }
    }

    { // Test the scaling sphere

      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = sphereTest(raySource, ray, center, sphereRad * gizmoSize);

      if (dist == 0. && tHit < firstHit) {
        firstHit = tHit;
        hitDist = dist;
        hitDim = 0;
        hitType = TransformHandle::Scale;
        hitNearest = nearestPoint;
      }
    }

    // = Process the result

    // clear selection before proceeding
    selectedType = TransformHandle::None;
    selectedDim = -1;

    if (hitType == TransformHandle::Rotation && hitDist < diskWidth) {
      // rotation is hovered

      // set new selection
      selectedType = TransformHandle::Rotation;
      selectedDim = hitDim;

      // if the mouse is clicked, start a drag
      if (ImGui::IsMouseClicked(0) && !io.WantCaptureMouse) {
        currentlyDragging = true;

        glm::vec3 nearestDir = glm::normalize(hitNearest - center);
        dragPrevVec = nearestDir;
      }
    } else if (hitType == TransformHandle::Translation && hitDist < diskWidth) {
      // translation is hovered

      // set new selection
      selectedType = TransformHandle::Translation;
      selectedDim = hitDim;

      // if the mouse is clicked, start a drag
      if (ImGui::IsMouseClicked(0) && !io.WantCaptureMouse) {
        currentlyDragging = true;

        dragPrevVec = hitNearest;
      }
    } else if (hitType == TransformHandle::Scale) {
      // scaling is hovered

      // set new selection
      selectedType = TransformHandle::Scale;
      selectedDim = -1;

      // if the mouse is clicked, start a drag
      if (ImGui::IsMouseClicked(0) && !io.WantCaptureMouse) {
        currentlyDragging = true;

        dragPrevVec = hitNearest;
      }
    }
  }

  return currentlyDragging || draggingAtStart;
}